

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataBase.cpp
# Opt level: O0

void __thiscall DataBase::printInVarMap(DataBase *this)

{
  bool bVar1;
  reference ppVar2;
  ostream *poVar3;
  double extraout_XMM0_Qa;
  _Self local_28;
  _Base_ptr local_20;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>
  local_18;
  iterator it;
  DataBase *this_local;
  
  it._M_node = (_Base_ptr)this;
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>
  ::_Rb_tree_iterator(&local_18);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  local_20 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
             ::begin(this->in_var_map);
  local_18._M_node = local_20;
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
         ::end(this->in_var_map);
    bVar1 = std::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>
             ::operator*(&local_18);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)ppVar2);
    poVar3 = std::operator<<(poVar3,": ");
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>
             ::operator*(&local_18);
    (**(ppVar2->second->super_Expression)._vptr_Expression)();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,extraout_XMM0_Qa);
    std::operator<<(poVar3,"  ---  ");
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>
    ::operator++(&local_18,0);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void DataBase::printInVarMap() {
  map<string, Variable *>::iterator it;
  cout << endl;
  for (it = this->in_var_map->begin(); it != in_var_map->end(); it++) {
    cout << (*it).first << ": " << (*it).second->calculate() <<
         "  ---  ";
  }
  cout << endl;
}